

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O1

void Gia_ManReportImprovement(Gia_Man_t *p,Gia_Man_t *pNew)

{
  int iVar1;
  int level;
  double dVar2;
  
  level = (int)p;
  iVar1 = p->nRegs;
  dVar2 = 0.0;
  if (iVar1 != 0) {
    dVar2 = ((double)(iVar1 - pNew->nRegs) * 100.0) / (double)iVar1;
  }
  Abc_Print(level,"REG: Beg = %5d. End = %5d. (R =%5.1f %%)  ",dVar2);
  iVar1 = ~(p->vCos->nSize + p->vCis->nSize) + p->nObjs;
  dVar2 = 0.0;
  if (iVar1 != 0) {
    dVar2 = ((double)(iVar1 - (~(pNew->vCos->nSize + pNew->vCis->nSize) + pNew->nObjs)) * 100.0) /
            (double)iVar1;
  }
  Abc_Print(level,"AND: Beg = %6d. End = %6d. (R =%5.1f %%)",dVar2);
  Abc_Print(level,"\n");
  return;
}

Assistant:

void Gia_ManReportImprovement( Gia_Man_t * p, Gia_Man_t * pNew )
{
    Abc_Print( 1, "REG: Beg = %5d. End = %5d. (R =%5.1f %%)  ",
        Gia_ManRegNum(p), Gia_ManRegNum(pNew),
        Gia_ManRegNum(p)? 100.0*(Gia_ManRegNum(p)-Gia_ManRegNum(pNew))/Gia_ManRegNum(p) : 0.0 );
    Abc_Print( 1, "AND: Beg = %6d. End = %6d. (R =%5.1f %%)",
        Gia_ManAndNum(p), Gia_ManAndNum(pNew),
        Gia_ManAndNum(p)? 100.0*(Gia_ManAndNum(p)-Gia_ManAndNum(pNew))/Gia_ManAndNum(p) : 0.0 );
    Abc_Print( 1, "\n" );
}